

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR COM_truncatefile(LispPTR *args)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  stat sbuf;
  stat local_c0;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  iVar3 = 100;
  if (iVar1 != 0) goto LAB_001200c4;
  uVar5 = args[2];
  if ((uVar5 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
  }
  Lisp_errno = (int *)(Lisp_world + uVar5);
  uVar5 = *args;
  if ((uVar5 & 0xfff0000) == 0xf0000) {
    uVar5 = uVar5 | 0xffff0000;
  }
  else if ((uVar5 & 0xfff0000) == 0xe0000) {
    uVar5 = uVar5 & 0xffff;
  }
  else {
    if ((uVar5 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
    }
    uVar5 = *(uint *)(Lisp_world + uVar5);
  }
  uVar2 = args[1];
  if ((uVar2 & 0xfff0000) == 0xf0000) {
    uVar2 = uVar2 | 0xffff0000;
  }
  else if ((uVar2 & 0xfff0000) == 0xe0000) {
    uVar2 = uVar2 & 0xffff;
  }
  else {
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    uVar2 = *(uint *)(Lisp_world + uVar2);
  }
  alarm(TIMEOUT_TIME);
  piVar4 = __errno_location();
  do {
    *piVar4 = 0;
    iVar3 = fstat(uVar5,&local_c0);
    if (iVar3 != -1) {
      alarm(0);
      if (((local_c0.st_mode & 0xf000) != 0x8000) || (local_c0.st_size == (int)uVar2)) {
        return 0x4c;
      }
      alarm(TIMEOUT_TIME);
      goto LAB_00120119;
    }
  } while (*piVar4 == 4);
  alarm(0);
  goto LAB_001200c1;
  while (*piVar4 == 4) {
LAB_00120119:
    *piVar4 = 0;
    iVar3 = ftruncate(uVar5,(long)(int)uVar2);
    if (iVar3 != -1) break;
  }
  alarm(0);
  if (iVar3 == 0) {
    alarm(TIMEOUT_TIME);
    do {
      *piVar4 = 0;
      iVar3 = fsync(uVar5);
      if (iVar3 != -1) break;
    } while (*piVar4 == 4);
    alarm(0);
    if (iVar3 == 0) {
      return 0x4c;
    }
  }
LAB_001200c1:
  iVar3 = *piVar4;
LAB_001200c4:
  *Lisp_errno = iVar3;
  return 0;
}

Assistant:

LispPTR COM_truncatefile(LispPTR *args)
{
  int fd;
  int length;
  int rval;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  fd = LispNumToCInt(args[0]);
  length = LispNumToCInt(args[1]);

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (!S_ISREG(sbuf.st_mode)) {
    /*
     * The request file is not a regular file.  We don't need to
     * truncate such file.
     */
    return (ATOM_T);
  }
  if ((off_t)length != sbuf.st_size) {
#ifdef DOS
    TIMEOUT(rval = chsize(fd, (off_t)length));
#else
    TIMEOUT(rval = ftruncate(fd, (off_t)length));
#endif /* DOS */
    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }

/*
 * TRUNCATEFILE FDEV method is invoked from FORCEOUTPUT Lisp function.
 * Thus we have to sync the file state here.
 */
#ifndef DOS
    TIMEOUT(rval = fsync(fd));
#endif

    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }
  return (ATOM_T);
}